

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  int *piVar1;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  Reader type_00;
  StringPtr scopeName_00;
  StringPtr scopeName_01;
  bool bVar2;
  uint16_t uVar3;
  undefined2 uVar4;
  Which WVar5;
  Which WVar6;
  uint16_t uVar7;
  uint64_t uVar8;
  Scope *pSVar9;
  Binding *pBVar10;
  Reader local_350;
  Scope *scope;
  Scope *__end6;
  Scope *__begin6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *__range6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *b;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *_b1684;
  uint64_t uStack_2e8;
  uint16_t index;
  uint64_t id;
  Reader param;
  Reader anyPointer;
  Reader local_250;
  Reader local_220;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1f0;
  char *local_1d8;
  size_t sStack_1d0;
  Reader local_1c0;
  undefined1 local_190 [8];
  Reader interfaceType;
  Reader local_130;
  undefined1 local_100 [8];
  Reader enumType;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_c0;
  char *local_a8;
  size_t sStack_a0;
  Reader local_90;
  undefined1 local_60 [8];
  Reader structType;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_local;
  Binding *result_local;
  Impl *this_local;
  StringPtr scopeName_local;
  
  structType._reader._40_8_ = brandBindings;
  WVar5 = capnp::schema::Type::Reader::which(&type);
  switch(WVar5) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    WVar5 = capnp::schema::Type::Reader::which(&type);
    result->which = (uint8_t)WVar5;
    break;
  case LIST:
    capnp::schema::Type::Reader::getList(&local_250,&type);
    capnp::schema::Type::List::Reader::getElementType(&local_220,&local_250);
    piVar1 = &anyPointer._reader.nestingLimit;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)piVar1,brandBindings
              );
    type_00._reader.capTable = local_220._reader.capTable;
    type_00._reader.segment = local_220._reader.segment;
    type_00._reader.data = local_220._reader.data;
    type_00._reader.pointers = local_220._reader.pointers;
    type_00._reader.dataSize = local_220._reader.dataSize;
    type_00._reader.pointerCount = local_220._reader.pointerCount;
    type_00._reader._38_2_ = local_220._reader._38_2_;
    type_00._reader.nestingLimit = local_220._reader.nestingLimit;
    type_00._reader._44_4_ = local_220._reader._44_4_;
    makeDep(this,result,type_00,scopeName,
            (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)piVar1);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
               &anyPointer._reader.nestingLimit);
    result->listDepth = result->listDepth + 1;
    break;
  case ENUM:
    capnp::schema::Type::Reader::getEnum((Reader *)local_100,&type);
    uVar8 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)local_100);
    capnp::schema::Type::Enum::Reader::getBrand(&local_130,(Reader *)local_100);
    piVar1 = &interfaceType._reader.nestingLimit;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)piVar1,brandBindings
              );
    brand_00._reader.capTable = local_130._reader.capTable;
    brand_00._reader.segment = local_130._reader.segment;
    brand_00._reader.data = local_130._reader.data;
    brand_00._reader.pointers = local_130._reader.pointers;
    brand_00._reader.dataSize = local_130._reader.dataSize;
    brand_00._reader.pointerCount = local_130._reader.pointerCount;
    brand_00._reader._38_2_ = local_130._reader._38_2_;
    brand_00._reader.nestingLimit = local_130._reader.nestingLimit;
    brand_00._reader._44_4_ = local_130._reader._44_4_;
    makeDep(this,result,uVar8,ENUM,ENUM,brand_00,scopeName,
            (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)piVar1);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
               &interfaceType._reader.nestingLimit);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct((Reader *)local_60,&type);
    uVar8 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)local_60);
    capnp::schema::Type::Struct::Reader::getBrand(&local_90,(Reader *)local_60);
    local_a8 = scopeName.content.ptr;
    sStack_a0 = scopeName.content.size_;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              (&local_c0,brandBindings);
    brand._reader.capTable = local_90._reader.capTable;
    brand._reader.segment = local_90._reader.segment;
    brand._reader.data = local_90._reader.data;
    brand._reader.pointers = local_90._reader.pointers;
    brand._reader.dataSize = local_90._reader.dataSize;
    brand._reader.pointerCount = local_90._reader.pointerCount;
    brand._reader._38_2_ = local_90._reader._38_2_;
    brand._reader.nestingLimit = local_90._reader.nestingLimit;
    brand._reader._44_4_ = local_90._reader._44_4_;
    scopeName_00.content.size_ = sStack_a0;
    scopeName_00.content.ptr = local_a8;
    makeDep(this,result,uVar8,STRUCT,STRUCT,brand,scopeName_00,&local_c0);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_c0);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface((Reader *)local_190,&type);
    uVar8 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)local_190);
    capnp::schema::Type::Interface::Reader::getBrand(&local_1c0,(Reader *)local_190);
    local_1d8 = scopeName.content.ptr;
    sStack_1d0 = scopeName.content.size_;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              (&local_1f0,brandBindings);
    brand_01._reader.capTable = local_1c0._reader.capTable;
    brand_01._reader.segment = local_1c0._reader.segment;
    brand_01._reader.data = local_1c0._reader.data;
    brand_01._reader.pointers = local_1c0._reader.pointers;
    brand_01._reader.dataSize = local_1c0._reader.dataSize;
    brand_01._reader.pointerCount = local_1c0._reader.pointerCount;
    brand_01._reader._38_2_ = local_1c0._reader._38_2_;
    brand_01._reader.nestingLimit = local_1c0._reader.nestingLimit;
    brand_01._reader._44_4_ = local_1c0._reader._44_4_;
    scopeName_01.content.size_ = sStack_1d0;
    scopeName_01.content.ptr = local_1d8;
    makeDep(this,result,uVar8,INTERFACE,INTERFACE,brand_01,scopeName_01,&local_1f0);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_1f0);
    break;
  case ANY_POINTER:
    result->which = '\x12';
    piVar1 = &param._reader.nestingLimit;
    capnp::schema::Type::Reader::getAnyPointer((Reader *)piVar1,&type);
    WVar6 = capnp::schema::Type::AnyPointer::Reader::which((Reader *)piVar1);
    if (WVar6 != UNCONSTRAINED) {
      if (WVar6 == PARAMETER) {
        capnp::schema::Type::AnyPointer::Reader::getParameter
                  ((Reader *)&id,(Reader *)&param._reader.nestingLimit);
        uStack_2e8 = capnp::schema::Type::AnyPointer::Parameter::Reader::getScopeId((Reader *)&id);
        _b1684._6_2_ = capnp::schema::Type::AnyPointer::Parameter::Reader::getParameterIndex
                                 ((Reader *)&id);
        __begin6 = (Scope *)kj::_::readMaybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>
                                      (brandBindings);
        if (__begin6 == (Scope *)0x0) {
          (result->field_4).scopeId = uStack_2e8;
          result->paramIndex = _b1684._6_2_;
        }
        else {
          __range6 = (ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)__begin6;
          b = (ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)__begin6;
          __end6 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                             ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)__begin6);
          pSVar9 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::end
                             ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)__begin6);
          for (; __end6 != pSVar9; __end6 = __end6 + 1) {
            if (__end6->typeId == uStack_2e8) {
              if ((__end6->isUnbound & 1U) != 0) {
                (result->field_4).scopeId = uStack_2e8;
                result->paramIndex = _b1684._6_2_;
                return;
              }
              if (__end6->bindingCount <= (uint)_b1684._6_2_) {
                return;
              }
              pBVar10 = __end6->bindings + _b1684._6_2_;
              bVar2 = pBVar10->isImplicitParameter;
              uVar7 = pBVar10->listDepth;
              uVar3 = pBVar10->paramIndex;
              uVar4 = *(undefined2 *)&pBVar10->field_0x6;
              result->which = pBVar10->which;
              result->isImplicitParameter = bVar2;
              result->listDepth = uVar7;
              result->paramIndex = uVar3;
              *(undefined2 *)&result->field_0x6 = uVar4;
              result->field_4 = pBVar10->field_4;
              return;
            }
          }
        }
      }
      else {
        if (WVar6 != IMPLICIT_METHOD_PARAMETER) {
          kj::_::unreachable();
        }
        result->isImplicitParameter = true;
        capnp::schema::Type::AnyPointer::Reader::getImplicitMethodParameter
                  (&local_350,(Reader *)&param._reader.nestingLimit);
        uVar7 = capnp::schema::Type::AnyPointer::ImplicitMethodParameter::Reader::getParameterIndex
                          (&local_350);
        result->paramIndex = uVar7;
      }
    }
    break;
  default:
    kj::_::unreachable();
  }
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  switch (type.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      result.which = static_cast<uint8_t>(type.which());
      return;

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      makeDep(result, structType.getTypeId(), schema::Type::STRUCT, schema::Node::STRUCT,
              structType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      makeDep(result, enumType.getTypeId(), schema::Type::ENUM, schema::Node::ENUM,
              enumType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      makeDep(result, interfaceType.getTypeId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              interfaceType.getBrand(), scopeName, brandBindings);
      return;
    }

    case schema::Type::LIST: {
      makeDep(result, type.getList().getElementType(), scopeName, brandBindings);
      ++result.listDepth;
      return;
    }

    case schema::Type::ANY_POINTER: {
      result.which = static_cast<uint8_t>(schema::Type::ANY_POINTER);
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          uint64_t id = param.getScopeId();
          uint16_t index = param.getParameterIndex();

          KJ_IF_SOME(b, brandBindings) {
            // TODO(perf): We could binary search here, but... bleh.
            for (auto& scope: b) {
              if (scope.typeId == id) {
                if (scope.isUnbound) {
                  // Unbound brand parameter.
                  result.scopeId = id;
                  result.paramIndex = index;
                  return;
                } else if (index >= scope.bindingCount) {
                  // Binding index out-of-range. Treat as AnyPointer. This is important to allow
                  // new type parameters to be added to existing types without breaking dependent
                  // schemas.
                  return;
                } else {
                  result = scope.bindings[index];
                  return;
                }
              }
            }
            return;
          } else {
            // Unbound brand parameter.
            result.scopeId = id;
            result.paramIndex = index;
            return;
          }
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          result.isImplicitParameter = true;
          result.paramIndex = anyPointer.getImplicitMethodParameter().getParameterIndex();
          return;
      }
      KJ_UNREACHABLE;
    }
  }